

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

int vs_has_more_data(bitstream *str)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint8_t *puVar4;
  int iVar5;
  long lVar6;
  
  if (str->dir == VS_ENCODE) {
    vs_has_more_data_cold_2();
LAB_00102645:
    iVar3 = -1;
  }
  else {
    if (str->type == VS_H262) {
      lVar6 = 0;
      if ((str->hasbyte != 0) &&
         ((~(-1 << ((char)str->bitpos + 1U & 0x1f)) & (uint)str->curbyte) != 0)) {
        return 1;
      }
    }
    else {
      if (str->type != VS_H264) {
        abort();
      }
      if (str->hasbyte == 0) {
        if (str->bytepos == str->bytesnum) {
          vs_has_more_data_cold_1();
          goto LAB_00102645;
        }
        puVar4 = str->bytes + str->bytepos;
        lVar6 = 1;
      }
      else {
        puVar4 = &str->curbyte;
        lVar6 = 0;
      }
      bVar1 = (byte)str->bitpos;
      if ((~(-1 << (bVar1 + 1 & 0x1f)) & (uint)*puVar4) != 1 << (bVar1 & 0x1f)) {
        return 1;
      }
    }
    lVar6 = lVar6 + str->bytepos;
    iVar2 = str->bytesnum;
    iVar5 = (int)lVar6;
    if ((iVar2 <= iVar5) || (iVar3 = 1, str->bytes[lVar6] == '\0')) {
      lVar6 = (long)iVar5 + 1;
      if (((iVar2 <= (int)lVar6) || (iVar3 = 1, str->bytes[lVar6] == '\0')) &&
         ((lVar6 = (long)iVar5 + 2, iVar2 <= (int)lVar6 || (iVar3 = 1, str->bytes[lVar6] < 3)))) {
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int vs_has_more_data(struct bitstream *str) {
	if (str->dir == VS_ENCODE) {
		fprintf (stderr, "vs_has_more_data called in encode mode\n");
		return -1;
	}
	int byte;
	int offs = 0;
	switch (str->type) {
		case VS_H264:
			if (!str->hasbyte) {
				if (str->bytepos == str->bytesnum) {
					fprintf (stderr, "no RBSP trailer byte\n");
					return -1;
				}
				offs = 1;
				byte = str->bytes[str->bytepos];
			} else {
				byte = str->curbyte;
				offs = 0;
			}
			byte &= (1 << (str->bitpos+1)) - 1;
			if (byte != (1 << str->bitpos))
				return 1;
			break;
		case VS_H262:
			byte = str->curbyte;
			byte &= (1 << (str->bitpos+1)) - 1;
			if (str->hasbyte && byte)
				return 1;
			break;
		default:
			abort();
	}
	offs += str->bytepos;
	if (offs < str->bytesnum && str->bytes[offs])
		return 1;
	if (offs+1 < str->bytesnum && str->bytes[offs+1])
		return 1;
	if (offs+2 < str->bytesnum && str->bytes[offs+2] > 2)
		return 1;
	/* followed by 00 00 00 or 00 00 01 or 00* EOF */
	return 0;

}